

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

size_t Q_GetLen(QMatrix *Q,size_t RoC)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((RoC == 0) || (Q->Dim < RoC)) {
      sVar2 = 0;
      LASError(LASRangeErr,"Q_GetLen",Q->Name,(char *)0x0,(char *)0x0);
    }
    else {
      sVar2 = Q->Len[RoC];
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t Q_GetLen(QMatrix *Q, size_t RoC)
/* returns the lenght of a row or column of the matrix Q */
{
    size_t Len;

    if (LASResult() == LASOK) {
        if (RoC > 0 && RoC <= Q->Dim) {
            Len = Q->Len[RoC];
        } else {
            LASError(LASRangeErr, "Q_GetLen", Q->Name, NULL, NULL);
            Len = 0;
        }
    } else {
        Len = 0;
    }
    return(Len);
}